

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

string * license::trim_copy(string *__return_storage_ptr__,string *string_to_trim)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  reference pcVar4;
  bool bVar5;
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [8];
  const_reverse_iterator rit;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator it;
  string *string_to_trim_local;
  
  it._M_current = (char *)string_to_trim;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _rit = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&rit);
    bVar5 = false;
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      iVar2 = isspace((int)*pcVar3);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  std::__cxx11::string::rbegin();
  while( true ) {
    local_38._M_current =
         (char *)std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::base(local_30);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_20);
    bVar5 = false;
    if (bVar1) {
      pcVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(local_30);
      iVar2 = isspace((int)*pcVar4);
      bVar5 = true;
      if (iVar2 == 0) {
        pcVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(local_30);
        bVar5 = *pcVar4 == '\0';
      }
    }
    if (!bVar5) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(local_30);
  }
  local_40._M_current = local_20._M_current;
  local_48._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_40,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

string trim_copy(const string &string_to_trim) {
	std::string::const_iterator it = string_to_trim.begin();
	while (it != string_to_trim.end() && isspace(*it)) {
		++it;
	}
	std::string::const_reverse_iterator rit = string_to_trim.rbegin();
	while (rit.base() != it && (isspace(*rit) || *rit == 0)) {
		++rit;
	}
	return std::string(it, rit.base());
}